

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

int Gia_ManDupDemiterFindMin(Vec_Wec_t *vSupps,Vec_Int_t *vTakenIns,Vec_Int_t *vTakenOuts)

{
  int iVar1;
  Vec_Int_t *p;
  undefined4 local_40;
  undefined4 local_3c;
  int CountBest;
  int Count;
  int iObjBest;
  int iObj;
  int k;
  int i;
  Vec_Int_t *vLevel;
  Vec_Int_t *vTakenOuts_local;
  Vec_Int_t *vTakenIns_local;
  Vec_Wec_t *vSupps_local;
  
  CountBest = -1;
  local_40 = 1000000000;
  for (iObj = 0; iVar1 = Vec_WecSize(vSupps), iObj < iVar1; iObj = iObj + 1) {
    p = Vec_WecEntry(vSupps,iObj);
    iVar1 = Vec_IntEntry(vTakenOuts,iObj);
    if (iVar1 == 0) {
      local_3c = 0;
      for (iObjBest = 0; iVar1 = Vec_IntSize(p), iObjBest < iVar1; iObjBest = iObjBest + 1) {
        iVar1 = Vec_IntEntry(p,iObjBest);
        iVar1 = Vec_IntEntry(vTakenIns,iVar1);
        local_3c = (uint)((iVar1 != 0 ^ 0xffU) & 1) + local_3c;
      }
      if (local_3c < local_40) {
        local_40 = local_3c;
        CountBest = iObj;
      }
    }
  }
  return CountBest;
}

Assistant:

int Gia_ManDupDemiterFindMin( Vec_Wec_t * vSupps, Vec_Int_t * vTakenIns, Vec_Int_t * vTakenOuts )
{
    Vec_Int_t * vLevel;
    int i, k, iObj, iObjBest = -1;
    int Count, CountBest = ABC_INFINITY;
    Vec_WecForEachLevel( vSupps, vLevel, i )
    {
        if ( Vec_IntEntry(vTakenOuts, i) )
            continue;
        Count = 0;
        Vec_IntForEachEntry( vLevel, iObj, k )
            Count += !Vec_IntEntry(vTakenIns, iObj);
        if ( CountBest > Count )
        {
            CountBest = Count;
            iObjBest = i;
        }
    }
    return iObjBest;
}